

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSerialReadInvert(uint gpio,uint invert)

{
  ulong uVar1;
  FILE *pFVar2;
  int iVar3;
  char *__format;
  
  pFVar2 = _stderr;
  uVar1 = (ulong)gpio;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar2,"%s %s: gpio=%d invert=%d\n",myTimeStamp::buf,"gpioSerialReadInvert",uVar1,
            (ulong)invert);
  }
  pFVar2 = _stderr;
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    fprintf(pFVar2,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
            "gpioSerialReadInvert");
    return -0x1f;
  }
  if (gpio < 0x20) {
    if (wfRx[uVar1].mode == 1) {
      if (invert < 2) {
        wfRx[uVar1].field_4.s.invert = invert;
        return 0;
      }
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x79;
      }
      myTimeStamp();
      fprintf(pFVar2,"%s %s: bad invert level for gpio %d (%d)\n",myTimeStamp::buf,
              "gpioSerialReadInvert",uVar1,(ulong)invert);
      return -0x79;
    }
    iVar3 = -0x26;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x26;
    }
    myTimeStamp();
    __format = "%s %s: no serial read on gpio (%d)\n";
  }
  else {
    iVar3 = -2;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -2;
    }
    myTimeStamp();
    __format = "%s %s: bad gpio (%d)\n";
  }
  fprintf(pFVar2,__format,myTimeStamp::buf,"gpioSerialReadInvert",uVar1);
  return iVar3;
}

Assistant:

int gpioSerialReadInvert(unsigned gpio, unsigned invert)
{
   DBG(DBG_USER, "gpio=%d invert=%d", gpio, invert);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (wfRx[gpio].mode != PI_WFRX_SERIAL)
      SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

   if ((invert < PI_BB_SER_NORMAL) ||
       (invert > PI_BB_SER_INVERT))
      SOFT_ERROR(PI_BAD_SER_INVERT,
         "bad invert level for gpio %d (%d)", gpio, invert);

   wfRx[gpio].s.invert = invert;

   return 0;
}